

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O2

void __thiscall QTextHtmlParser::parse(QTextHtmlParser *this)

{
  char16_t cVar1;
  int iVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    iVar2 = this->pos;
    if (this->len <= iVar2) break;
    this->pos = iVar2 + 1;
    cVar1 = (this->txt).d.ptr[iVar2];
    if (cVar1 == L'&') {
      parseEntity((QString *)&QStack_38,this);
      iVar3 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
      QString::append((QString *)&iVar3.i[-1]->text);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    }
    else if (cVar1 == L'<') {
      parseTag(this);
    }
    else {
      iVar3 = QList<QTextHtmlParserNode_*>::end(&this->nodes);
      QString::append((QChar)((short)iVar3.i[-1] + L'\x18'));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::parse()
{
    while (pos < len) {
        QChar c = txt.at(pos++);
        if (c == u'<') {
            parseTag();
        } else if (c == u'&') {
            nodes.last()->text += parseEntity();
        } else {
            nodes.last()->text += c;
        }
    }
}